

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

type __thiscall
duckdb::Deserializer::
Read<duckdb::unique_ptr<duckdb::ExtensionTypeInfo,std::default_delete<duckdb::ExtensionTypeInfo>,true>,duckdb::ExtensionTypeInfo>
          (Deserializer *this)

{
  pointer pLVar1;
  int iVar2;
  pointer *__ptr;
  Deserializer *in_RSI;
  pointer local_20;
  
  this->_vptr_Deserializer = (_func_int **)0x0;
  iVar2 = (*in_RSI->_vptr_Deserializer[10])();
  if ((char)iVar2 != '\0') {
    (*in_RSI->_vptr_Deserializer[6])();
    ExtensionTypeInfo::Deserialize((ExtensionTypeInfo *)&stack0xffffffffffffffe0,in_RSI);
    pLVar1 = local_20;
    local_20 = (pointer)0x0;
    std::__uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
    ::reset((__uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
             *)this,(pointer)pLVar1);
    pLVar1 = local_20;
    if (local_20 != (pointer)0x0) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&(local_20->value).is_null);
      std::vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>::
      ~vector((vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
              pLVar1);
      operator_delete(pLVar1);
    }
    (*in_RSI->_vptr_Deserializer[7])();
  }
  (*in_RSI->_vptr_Deserializer[0xb])();
  return (unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>)
         (unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>)
         this;
}

Assistant:

inline typename std::enable_if<is_unique_ptr<T>::value && has_deserialize<ELEMENT_TYPE>::value, T>::type Read() {
		unique_ptr<ELEMENT_TYPE> ptr = nullptr;
		auto is_present = OnNullableBegin();
		if (is_present) {
			OnObjectBegin();
			ptr = ELEMENT_TYPE::Deserialize(*this);
			OnObjectEnd();
		}
		OnNullableEnd();
		return ptr;
	}